

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O1

void ResetLineAfterWrap(TidyPrintImpl *pprint)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  uint *puVar7;
  
  uVar2 = pprint->linelen;
  uVar3 = pprint->wraphere;
  uVar5 = 0;
  if (uVar3 < uVar2) {
    puVar6 = pprint->linebuf;
    puVar7 = puVar6 + uVar3;
    puVar1 = puVar6 + uVar2;
    iVar4 = pprint->indent[0].attrValStart;
    if ((iVar4 != 0) && (uVar3 < uVar2 && ((int)uVar3 <= iVar4 || iVar4 < 1))) {
      do {
        if (*puVar7 != 0x20) break;
        puVar7 = puVar7 + 1;
        pprint->wraphere = pprint->wraphere + 1;
      } while (puVar7 < puVar1);
    }
    for (; puVar7 < puVar1; puVar7 = puVar7 + 1) {
      *puVar6 = *puVar7;
      puVar6 = puVar6 + 1;
    }
    uVar5 = pprint->linelen - pprint->wraphere;
  }
  pprint->linelen = uVar5;
  ResetLine(pprint);
  return;
}

Assistant:

static void ResetLineAfterWrap( TidyPrintImpl* pprint )
{
    if ( pprint->linelen > pprint->wraphere )
    {
        uint *p = pprint->linebuf;
        uint *q = p + pprint->wraphere;
        uint *end = p + pprint->linelen;

        if ( ! IsWrapInAttrVal(pprint) )
        {
            while ( q < end && *q == ' ' )
                ++q, ++pprint->wraphere;
        }

        while ( q < end )
            *p++ = *q++;

        pprint->linelen -= pprint->wraphere;
    }
    else
    {
        pprint->linelen = 0;
    }

    ResetLine( pprint );
}